

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *customStep,cmGeneratorTarget *target)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer pbVar4;
  string cmd;
  ofstream script;
  char local_261;
  string *local_260;
  string local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_238 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_238;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_260 = __return_storage_ptr__;
  if (target == (cmGeneratorTarget *)0x0) {
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_230,target);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(customStep->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::ofstream::ofstream(local_230,(__return_storage_ptr__->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"set -e\n\n",8);
  pbVar4 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,pcVar2,pcVar2 + pbVar4->_M_string_length);
      cmsys::SystemTools::ReplaceString(&local_258,"$$","$");
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,local_258._M_dataplus._M_p,local_258._M_string_length
                         );
      local_261 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_261,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  return local_260;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = this->GetCurrentBinaryDirectory();
    scriptPath += "/CMakeFiles";
  }
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}